

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primref_mb.h
# Opt level: O3

void std::__move_median_to_first<embree::PrimRefMB*,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,undefined8 *__a,undefined8 *__b,undefined8 *__c)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  
  uVar10 = CONCAT44(*(undefined4 *)((long)__a + 0x1c),*(undefined4 *)((long)__a + 0xc));
  uVar12 = CONCAT44(*(undefined4 *)((long)__b + 0x1c),*(undefined4 *)((long)__b + 0xc));
  uVar11 = CONCAT44(*(undefined4 *)((long)__c + 0x1c),*(undefined4 *)((long)__c + 0xc));
  if (uVar10 < uVar12) {
    if (uVar12 < uVar11) {
      uVar2 = *__result;
      uVar3 = __result[1];
      uVar4 = __result[2];
      uVar5 = __result[3];
      uVar6 = __result[4];
      uVar7 = __result[5];
      uVar8 = __result[6];
      uVar9 = __result[7];
      uVar1 = __b[1];
      *__result = *__b;
      __result[1] = uVar1;
      uVar1 = __b[3];
      __result[2] = __b[2];
      __result[3] = uVar1;
      uVar1 = __b[5];
      __result[4] = __b[4];
      __result[5] = uVar1;
      uVar1 = __b[7];
      __result[6] = __b[6];
      __result[7] = uVar1;
      uVar1 = __result[8];
      *(undefined4 *)(__result + 8) = *(undefined4 *)(__b + 8);
      *(undefined4 *)((long)__result + 0x44) = *(undefined4 *)((long)__b + 0x44);
      *__b = uVar2;
      __b[1] = uVar3;
      __b[2] = uVar4;
      __b[3] = uVar5;
      __b[4] = uVar6;
      __b[5] = uVar7;
      __b[6] = uVar8;
      __b[7] = uVar9;
      __b[8] = uVar1;
      return;
    }
    uVar27 = *(undefined4 *)__result;
    uVar28 = *(undefined4 *)((long)__result + 4);
    uVar29 = *(undefined4 *)(__result + 1);
    uVar30 = *(undefined4 *)((long)__result + 0xc);
    uVar23 = *(undefined4 *)(__result + 2);
    uVar24 = *(undefined4 *)((long)__result + 0x14);
    uVar25 = *(undefined4 *)(__result + 3);
    uVar26 = *(undefined4 *)((long)__result + 0x1c);
    uVar19 = *(undefined4 *)(__result + 4);
    uVar20 = *(undefined4 *)((long)__result + 0x24);
    uVar21 = *(undefined4 *)(__result + 5);
    uVar22 = *(undefined4 *)((long)__result + 0x2c);
    uVar15 = *(undefined4 *)(__result + 6);
    uVar16 = *(undefined4 *)((long)__result + 0x34);
    uVar17 = *(undefined4 *)(__result + 7);
    uVar18 = *(undefined4 *)((long)__result + 0x3c);
    uVar1 = __result[8];
    uVar13 = (undefined4)uVar1;
    uVar14 = (undefined4)((ulong)uVar1 >> 0x20);
    if (uVar11 <= uVar10) {
      uVar2 = __a[1];
      *__result = *__a;
      __result[1] = uVar2;
      uVar2 = __a[3];
      __result[2] = __a[2];
      __result[3] = uVar2;
      uVar2 = __a[5];
      __result[4] = __a[4];
      __result[5] = uVar2;
      uVar2 = __a[7];
      __result[6] = __a[6];
      __result[7] = uVar2;
      *(undefined4 *)(__result + 8) = *(undefined4 *)(__a + 8);
      *(undefined4 *)((long)__result + 0x44) = *(undefined4 *)((long)__a + 0x44);
      *(undefined4 *)__a = uVar27;
      *(undefined4 *)((long)__a + 4) = uVar28;
      *(undefined4 *)(__a + 1) = uVar29;
      *(undefined4 *)((long)__a + 0xc) = uVar30;
      *(undefined4 *)(__a + 2) = uVar23;
      *(undefined4 *)((long)__a + 0x14) = uVar24;
      *(undefined4 *)(__a + 3) = uVar25;
      *(undefined4 *)((long)__a + 0x1c) = uVar26;
      *(undefined4 *)(__a + 4) = uVar19;
      *(undefined4 *)((long)__a + 0x24) = uVar20;
      *(undefined4 *)(__a + 5) = uVar21;
      *(undefined4 *)((long)__a + 0x2c) = uVar22;
      *(undefined4 *)(__a + 6) = uVar15;
      *(undefined4 *)((long)__a + 0x34) = uVar16;
      *(undefined4 *)(__a + 7) = uVar17;
      *(undefined4 *)((long)__a + 0x3c) = uVar18;
      __a[8] = uVar1;
      return;
    }
  }
  else {
    if (uVar10 < uVar11) {
      uVar2 = *__result;
      uVar3 = __result[1];
      uVar4 = __result[2];
      uVar5 = __result[3];
      uVar6 = __result[4];
      uVar7 = __result[5];
      uVar8 = __result[6];
      uVar9 = __result[7];
      uVar1 = __a[1];
      *__result = *__a;
      __result[1] = uVar1;
      uVar1 = __a[3];
      __result[2] = __a[2];
      __result[3] = uVar1;
      uVar1 = __a[5];
      __result[4] = __a[4];
      __result[5] = uVar1;
      uVar1 = __a[7];
      __result[6] = __a[6];
      __result[7] = uVar1;
      uVar1 = __result[8];
      *(undefined4 *)(__result + 8) = *(undefined4 *)(__a + 8);
      *(undefined4 *)((long)__result + 0x44) = *(undefined4 *)((long)__a + 0x44);
      *__a = uVar2;
      __a[1] = uVar3;
      __a[2] = uVar4;
      __a[3] = uVar5;
      __a[4] = uVar6;
      __a[5] = uVar7;
      __a[6] = uVar8;
      __a[7] = uVar9;
      __a[8] = uVar1;
      return;
    }
    uVar27 = *(undefined4 *)__result;
    uVar28 = *(undefined4 *)((long)__result + 4);
    uVar29 = *(undefined4 *)(__result + 1);
    uVar30 = *(undefined4 *)((long)__result + 0xc);
    uVar23 = *(undefined4 *)(__result + 2);
    uVar24 = *(undefined4 *)((long)__result + 0x14);
    uVar25 = *(undefined4 *)(__result + 3);
    uVar26 = *(undefined4 *)((long)__result + 0x1c);
    uVar19 = *(undefined4 *)(__result + 4);
    uVar20 = *(undefined4 *)((long)__result + 0x24);
    uVar21 = *(undefined4 *)(__result + 5);
    uVar22 = *(undefined4 *)((long)__result + 0x2c);
    uVar15 = *(undefined4 *)(__result + 6);
    uVar16 = *(undefined4 *)((long)__result + 0x34);
    uVar17 = *(undefined4 *)(__result + 7);
    uVar18 = *(undefined4 *)((long)__result + 0x3c);
    uVar1 = __result[8];
    uVar13 = (undefined4)uVar1;
    uVar14 = (undefined4)((ulong)uVar1 >> 0x20);
    if (uVar11 <= uVar12) {
      uVar2 = __b[1];
      *__result = *__b;
      __result[1] = uVar2;
      uVar2 = __b[3];
      __result[2] = __b[2];
      __result[3] = uVar2;
      uVar2 = __b[5];
      __result[4] = __b[4];
      __result[5] = uVar2;
      uVar2 = __b[7];
      __result[6] = __b[6];
      __result[7] = uVar2;
      *(undefined4 *)(__result + 8) = *(undefined4 *)(__b + 8);
      *(undefined4 *)((long)__result + 0x44) = *(undefined4 *)((long)__b + 0x44);
      *(undefined4 *)__b = uVar27;
      *(undefined4 *)((long)__b + 4) = uVar28;
      *(undefined4 *)(__b + 1) = uVar29;
      *(undefined4 *)((long)__b + 0xc) = uVar30;
      *(undefined4 *)(__b + 2) = uVar23;
      *(undefined4 *)((long)__b + 0x14) = uVar24;
      *(undefined4 *)(__b + 3) = uVar25;
      *(undefined4 *)((long)__b + 0x1c) = uVar26;
      *(undefined4 *)(__b + 4) = uVar19;
      *(undefined4 *)((long)__b + 0x24) = uVar20;
      *(undefined4 *)(__b + 5) = uVar21;
      *(undefined4 *)((long)__b + 0x2c) = uVar22;
      *(undefined4 *)(__b + 6) = uVar15;
      *(undefined4 *)((long)__b + 0x34) = uVar16;
      *(undefined4 *)(__b + 7) = uVar17;
      *(undefined4 *)((long)__b + 0x3c) = uVar18;
      __b[8] = uVar1;
      return;
    }
  }
  uVar1 = __c[1];
  *__result = *__c;
  __result[1] = uVar1;
  uVar1 = __c[3];
  __result[2] = __c[2];
  __result[3] = uVar1;
  uVar1 = __c[5];
  __result[4] = __c[4];
  __result[5] = uVar1;
  uVar1 = __c[7];
  __result[6] = __c[6];
  __result[7] = uVar1;
  *(undefined4 *)(__result + 8) = *(undefined4 *)(__c + 8);
  *(undefined4 *)((long)__result + 0x44) = *(undefined4 *)((long)__c + 0x44);
  *(undefined4 *)__c = uVar27;
  *(undefined4 *)((long)__c + 4) = uVar28;
  *(undefined4 *)(__c + 1) = uVar29;
  *(undefined4 *)((long)__c + 0xc) = uVar30;
  *(undefined4 *)(__c + 2) = uVar23;
  *(undefined4 *)((long)__c + 0x14) = uVar24;
  *(undefined4 *)(__c + 3) = uVar25;
  *(undefined4 *)((long)__c + 0x1c) = uVar26;
  *(undefined4 *)(__c + 4) = uVar19;
  *(undefined4 *)((long)__c + 0x24) = uVar20;
  *(undefined4 *)(__c + 5) = uVar21;
  *(undefined4 *)((long)__c + 0x2c) = uVar22;
  *(undefined4 *)(__c + 6) = uVar15;
  *(undefined4 *)((long)__c + 0x34) = uVar16;
  *(undefined4 *)(__c + 7) = uVar17;
  *(undefined4 *)((long)__c + 0x3c) = uVar18;
  __c[8] = CONCAT44(uVar14,uVar13);
  return;
}

Assistant:

__forceinline unsigned geomID() const {
      return lbounds.bounds0.lower.a;
    }